

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::constantValueCheck(TParseContext *this,TIntermTyped *node,char *token)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *token_local;
  TIntermTyped *node_local;
  TParseContext *this_local;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])();
  bVar1 = TQualifier::isConstant((TQualifier *)CONCAT44(extraout_var,iVar2));
  if (!bVar1) {
    iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,CONCAT44(extraout_var_00,iVar2),"constant expression required",token,"");
  }
  return;
}

Assistant:

void TParseContext::constantValueCheck(TIntermTyped* node, const char* token)
{
    if (! node->getQualifier().isConstant())
        error(node->getLoc(), "constant expression required", token, "");
}